

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_lore_name(parser *p)

{
  char *name;
  monster_race *pmVar1;
  monster_lore *local_20;
  monster_lore *l;
  monster_race *race;
  parser *p_local;
  
  name = parser_getstr(p,"name");
  pmVar1 = lookup_monster(name);
  local_20 = (monster_lore *)0x0;
  if (pmVar1 != (monster_race *)0x0) {
    local_20 = l_list + pmVar1->ridx;
    local_20->ridx = pmVar1->ridx;
    local_20->friends = (monster_friends *)0x0;
    local_20->friends_base = (monster_friends_base *)0x0;
  }
  parser_setpriv(p,local_20);
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_lore_name(struct parser *p) {
	struct monster_race *race = lookup_monster(parser_getstr(p, "name"));
	struct monster_lore *l = NULL;

	/* Only set lore if we have a race, to allow for non-existent monsters */
	if (race) {
		l = &l_list[race->ridx];
		l->ridx = race->ridx;
		l->friends = NULL;
		l->friends_base = NULL;
	}
	parser_setpriv(p, l);
	return PARSE_ERROR_NONE;
}